

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O1

int snprintf_long_canframe(char *buf,size_t size,cu_t *cu,int view)

{
  __u8 _Var1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  char *pcVar7;
  char cVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  char cVar13;
  int iVar14;
  uint uVar15;
  byte *pbVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  
  if (size == 0) {
    size = 0;
    goto LAB_00104cf9;
  }
  bVar3 = (cu->fd).len;
  if ((char)bVar3 < '\0') {
    uVar4 = (uint)(cu->xl).len;
    uVar18 = 0x40;
    if ((cu->xl).len < 0x40) {
      uVar18 = uVar4;
    }
    if ((ulong)(uVar18 * 3 + 0x29 & 0xffff) <= size - 1) {
      if ((view & 0x10U) == 0) {
        uVar15 = (cu->cc).can_id & 0x7ff;
        lVar10 = 3;
        do {
          buf[lVar10 + -1] = "0123456789ABCDEF"[uVar15 & 0xf];
          uVar15 = uVar15 >> 4;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
        lVar10 = 3;
      }
      else {
        builtin_strncpy(buf,"     ",5);
        uVar15 = (cu->cc).can_id & 0x7ff;
        lVar10 = 7;
        do {
          buf[lVar10] = "0123456789ABCDEF"[uVar15 & 0xf];
          uVar15 = uVar15 >> 4;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 4);
        lVar10 = 8;
      }
      iVar6 = sprintf(buf + lVar10," [%04d] (%02X|%02X:%02X:%08X) ",(ulong)uVar4,
                      (ulong)(byte)cu->field3[2],(ulong)(cu->fd).len,(ulong)(cu->cc).__pad,
                      (cu->xl).af);
      uVar15 = iVar6 + (int)lVar10;
      if (uVar4 == 0) {
        size = (size_t)uVar15;
      }
      else {
        uVar9 = 0;
        do {
          lVar10 = (long)(int)uVar15;
          bVar3 = cu->field3[uVar9 + 0xc];
          buf[lVar10] = "0123456789ABCDEF"[bVar3 >> 4];
          buf[lVar10 + 1] = "0123456789ABCDEF"[bVar3 & 0xf];
          size = lVar10 + 2;
          uVar9 = uVar9 + 1;
          if (uVar9 < uVar18) {
            buf[size] = ' ';
            size = (size_t)(uVar15 + 3);
          }
          uVar15 = (uint)size;
        } while (uVar18 != uVar9);
      }
      if ((ushort)uVar18 < (cu->xl).len) {
        iVar6 = (int)size;
        buf[(long)iVar6 + 4] = '\0';
        builtin_strncpy(buf + iVar6," ...",4);
        size = (size_t)(iVar6 + 4);
      }
      buf[(int)size] = '\0';
      goto LAB_00104cf9;
    }
  }
  else {
    _Var1 = (cu->cc).__pad;
    uVar18 = 0x40;
    if (_Var1 == '\0') {
      uVar18 = 8;
    }
    bVar17 = (byte)uVar18;
    if (bVar3 <= bVar17) {
      uVar18 = (uint)bVar3;
    }
    iVar6 = 9;
    if ((view & 2U) == 0) {
      iVar6 = 3;
    }
    bVar5 = (byte)uVar18;
    uVar9 = 0x24;
    if (((cu->cc).can_id >> 0x1e & 1) == 0) {
      uVar9 = (ulong)(iVar6 * uVar18) + 0x11;
      if ((bVar5 < 9) && ((((cu->cc).can_id >> 0x1d & 1) != 0 || ((view & 1U) != 0)))) {
        uVar9 = (ulong)((8 - uVar18) * iVar6) + (ulong)(iVar6 * uVar18) + 0x20;
      }
    }
    if (uVar9 <= size - 1) {
      builtin_strncpy(buf,"               ",0xf);
      uVar4 = (cu->cc).can_id;
      if ((uVar4 >> 0x1d & 1) == 0) {
        if ((int)uVar4 < 0) {
          uVar4 = uVar4 & 0x1fffffff;
          lVar10 = 8;
          do {
            buf[lVar10 + -1] = "0123456789ABCDEF"[uVar4 & 0xf];
            uVar4 = uVar4 >> 4;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
          goto LAB_00104941;
        }
        uVar4 = uVar4 & 0x7ff;
        if ((view & 0x10U) != 0) {
          lVar10 = 7;
          do {
            buf[lVar10] = "0123456789ABCDEF"[uVar4 & 0xf];
            uVar4 = uVar4 >> 4;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 4);
          goto LAB_00104941;
        }
        lVar10 = 3;
        do {
          buf[lVar10 + -1] = "0123456789ABCDEF"[uVar4 & 0xf];
          uVar4 = uVar4 >> 4;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
        lVar10 = 5;
      }
      else {
        uVar4 = uVar4 & 0x3fffffff;
        lVar10 = 8;
        do {
          buf[lVar10 + -1] = "0123456789ABCDEF"[uVar4 & 0xf];
          uVar4 = uVar4 >> 4;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
LAB_00104941:
        lVar10 = 10;
      }
      iVar14 = (int)lVar10;
      if (_Var1 == '\0') {
        if ((view & 0x20U) == 0) {
          buf[lVar10 + 1] = '[';
          cVar8 = bVar5 + 0x30;
          cVar13 = ']';
        }
        else {
          uVar4 = (uint)(cu->cc).len8_dlc;
          if (6 < (byte)((cu->cc).len8_dlc - 9)) {
            uVar4 = uVar18;
          }
          bVar12 = (byte)uVar4;
          if (uVar18 != 8) {
            bVar12 = bVar5;
          }
          buf[lVar10 + 1] = '{';
          cVar8 = "0123456789ABCDEF"[bVar12];
          cVar13 = '}';
        }
        buf[lVar10 + 2] = cVar8;
        buf[lVar10 + 3] = cVar13;
        if ((cu->field3[3] & 0x40) != 0) {
          builtin_strncpy(buf + lVar10 + 5," remote request",0x10);
          size = (size_t)(iVar14 + 0x14);
          goto LAB_00104cf9;
        }
      }
      else {
        buf[lVar10] = '[';
        bVar12 = (byte)(uVar18 / 10);
        buf[lVar10 + 1] = bVar12 | 0x30;
        buf[lVar10 + 2] = bVar5 + bVar12 * -10 | 0x30;
        buf[lVar10 + 3] = ']';
      }
      size = (size_t)(iVar14 + 5);
      if ((view & 2U) == 0) {
        if ((view & 4U) == 0) {
          if (bVar3 != 0) {
            uVar9 = (ulong)(iVar14 + 5);
            uVar11 = 0;
            do {
              buf[uVar9] = ' ';
              bVar12 = cu->field3[uVar11 + 8];
              buf[uVar9 + 1] = "0123456789ABCDEF"[bVar12 >> 4];
              buf[uVar9 + 2] = "0123456789ABCDEF"[bVar12 & 0xf];
              uVar9 = uVar9 + 3;
              uVar11 = uVar11 + 1;
            } while (uVar18 + (uVar18 == 0) != uVar11);
LAB_00104b3c:
            size = uVar9 & 0xffffffff;
          }
        }
        else if (bVar3 != 0) {
          uVar9 = (ulong)(iVar14 + 5);
          lVar10 = 0;
          uVar4 = uVar18;
          do {
            buf[uVar9] = (lVar10 != 0) << 6 | 0x20;
            bVar12 = cu->field3[lVar10 + (ulong)(uVar18 - 1) + 8];
            buf[uVar9 + 1] = "0123456789ABCDEF"[bVar12 >> 4];
            buf[uVar9 + 2] = "0123456789ABCDEF"[bVar12 & 0xf];
            uVar9 = uVar9 + 3;
            uVar15 = uVar4 - 1;
            bVar2 = 0 < (int)uVar4;
            lVar10 = lVar10 + -1;
            uVar4 = uVar15;
          } while (uVar15 != 0 && bVar2);
          goto LAB_00104b3c;
        }
      }
      else if ((view & 4U) == 0) {
        if (bVar3 != 0) {
          uVar9 = 0;
          do {
            iVar19 = (int)size;
            buf[iVar19] = ' ';
            pbVar16 = (byte *)(buf + (iVar19 + 1));
            iVar14 = -1;
            do {
              *pbVar16 = ((byte)cu->field3[uVar9 + 8] >> (iVar14 + 8U & 0x1f) & 1) == 0 ^ 0x31;
              pbVar16 = pbVar16 + 1;
              iVar14 = iVar14 + -1;
            } while (iVar14 != -9);
            size = (size_t)(iVar19 + 9);
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar18 + (uVar18 == 0));
          size = (size_t)(iVar19 + 9);
        }
      }
      else if (bVar3 != 0) {
        uVar9 = (ulong)(uVar18 - 1);
        do {
          iVar19 = (int)size;
          buf[iVar19] = (uVar9 != uVar18 - 1) << 6 | 0x20;
          pbVar16 = (byte *)(buf + (iVar19 + 1));
          iVar14 = -1;
          do {
            *pbVar16 = ((byte)cu->field3[uVar9 + 8] >> (iVar14 + 8U & 0x1f) & 1) == 0 ^ 0x31;
            pbVar16 = pbVar16 + 1;
            iVar14 = iVar14 + -1;
          } while (iVar14 != -9);
          size = (size_t)(iVar19 + 9);
          iVar14 = (int)uVar9;
          uVar9 = uVar9 - 1;
        } while (0 < iVar14);
        size = (size_t)(iVar19 + 9);
      }
      iVar14 = (int)size;
      buf[iVar14] = '\0';
      if (bVar5 < 9) {
        pcVar7 = buf + iVar14;
        if ((cu->field3[3] & 0x20) == 0) {
          if ((view & 1U) != 0) {
            iVar6 = (8 - uVar18) * iVar6;
            uVar9 = (ulong)(iVar6 + 4);
            iVar6 = iVar14 + iVar6 + 4;
            if ((view & 4U) == 0) {
              sprintf(pcVar7,"%*s",uVar9);
              if (bVar3 != 0) {
                uVar9 = 0;
                do {
                  cVar8 = cu->field3[uVar9 + 8];
                  if (0x5e < (byte)(cVar8 - 0x20U)) {
                    cVar8 = '.';
                  }
                  buf[uVar9 + (long)iVar6] = cVar8;
                  uVar9 = uVar9 + 1;
                } while (uVar18 + (uVar18 == 0) != uVar9);
                iVar6 = iVar6 + (int)uVar9;
              }
              (buf + iVar6)[0] = '\'';
              (buf + iVar6)[1] = '\0';
            }
            else {
              sprintf(pcVar7,"%*s",uVar9,"`");
              if (bVar3 != 0) {
                if (bVar17 < bVar3) {
                  bVar3 = bVar17;
                }
                pcVar7 = buf + iVar6;
                uVar9 = (ulong)bVar3;
                do {
                  cVar8 = cu->field3[uVar9 + 7];
                  if (0x5e < (byte)(cVar8 - 0x20U)) {
                    cVar8 = '.';
                  }
                  *pcVar7 = cVar8;
                  pcVar7 = pcVar7 + 1;
                  iVar6 = iVar6 + 1;
                  bVar2 = 1 < (long)uVar9;
                  uVar9 = uVar9 - 1;
                } while (bVar2);
              }
              (buf + iVar6)[0] = '`';
              (buf + iVar6)[1] = '\0';
            }
            size = (size_t)(iVar6 + 1);
          }
        }
        else {
          iVar6 = sprintf(pcVar7,"%*s",(ulong)((8 - uVar18) * iVar6 + 0xd),"ERRORFRAME");
          size = (size_t)(uint)(iVar6 + iVar14);
        }
      }
      goto LAB_00104cf9;
    }
  }
  memset(buf,0x2d,size - 1);
  buf[size - 1] = '\0';
LAB_00104cf9:
  return (int)size;
}

Assistant:

int snprintf_long_canframe(char *buf, size_t size, cu_t *cu, int view)
{
	/* documentation see lib.h */

	unsigned char is_canfd = cu->fd.flags;
	int i, j, dlen, offset;
	size_t maxsize;
	int len;

	/* ensure space for string termination */
	if (size < 1)
		return size;

	/* handle CAN XL frames */
	if (cu->xl.flags & CANXL_XLF) {
		len = cu->xl.len;

		/* crop to CANFD_MAX_DLEN */
		if (len > CANFD_MAX_DLEN)
			dlen = CANFD_MAX_DLEN;
		else
			dlen = len;

		/* check if the CAN frame fits into the provided buffer */
		if (sizeof(".....123 [2048] (00|11:22:12345678)  ...") + 3 * dlen > size - 1) {
			/* mark buffer overflow in output */
			memset(buf, '-', size - 1);
			buf[size - 1] = 0;
			return size;
		}

		if (view & CANLIB_VIEW_INDENT_SFF) {
			memset(buf, ' ', 5);
			put_sff_id(buf + 5, cu->xl.prio & CANXL_PRIO_MASK);
			offset = 8;
		} else {
			put_sff_id(buf, cu->xl.prio & CANXL_PRIO_MASK);
			offset = 3;
		}

		/* print prio and CAN XL header content */
		offset += sprintf(buf + offset, " [%04d] (%02X|%02X:%02X:%08X) ",
				  len,
				  (canid_t)(cu->xl.prio & CANXL_VCID_MASK) >> CANXL_VCID_OFFSET,
				  cu->xl.flags, cu->xl.sdt, cu->xl.af);

		for (i = 0; i < dlen; i++) {
			put_hex_byte(buf + offset, cu->xl.data[i]);
			offset += 2;
			if (i + 1 < dlen)
				buf[offset++] = ' ';
		}

		/* indicate cropped output */
		if (cu->xl.len > dlen)
			offset += sprintf(buf + offset, " ...");

		buf[offset] = 0;

		return offset;
	}

	/* ensure max length values */
	if (is_canfd)
		len = (cu->fd.len > CANFD_MAX_DLEN) ? CANFD_MAX_DLEN : cu->fd.len;
	else
		len = (cu->fd.len > CAN_MAX_DLEN) ? CAN_MAX_DLEN : cu->fd.len;

	/* check if the CAN frame fits into the provided buffer */
	maxsize = sizeof("12345678  [12]  ");
	if (view & CANLIB_VIEW_BINARY)
		dlen = 9; /* _10101010 */
	else
		dlen = 3; /* _AA */

	if (cu->fd.can_id & CAN_RTR_FLAG) {
		maxsize += sizeof("    remote request");
	} else {
		maxsize += len * dlen;

		if (len <= CAN_MAX_DLEN) {
			if (cu->fd.can_id & CAN_ERR_FLAG) {
				maxsize += sizeof("    ERRORFRAME");
				maxsize += (8 - len) * dlen;
			} else if (view & CANLIB_VIEW_ASCII) {
				maxsize += sizeof("    'a.b.CDEF'");
				maxsize += (8 - len) * dlen;
			}
		}
	}

	if (maxsize > size - 1) {
		/* mark buffer overflow in output */
		memset(buf, '-', size - 1);
		buf[size - 1] = 0;
		return size;
	}

	/* initialize space for CAN-ID and length information */
	memset(buf, ' ', 15);

	if (cu->cc.can_id & CAN_ERR_FLAG) {
		put_eff_id(buf, cu->cc.can_id & (CAN_ERR_MASK | CAN_ERR_FLAG));
		offset = 10;
	} else if (cu->fd.can_id & CAN_EFF_FLAG) {
		put_eff_id(buf, cu->fd.can_id & CAN_EFF_MASK);
		offset = 10;
	} else {
		if (view & CANLIB_VIEW_INDENT_SFF) {
			put_sff_id(buf + 5, cu->fd.can_id & CAN_SFF_MASK);
			offset = 10;
		} else {
			put_sff_id(buf, cu->fd.can_id & CAN_SFF_MASK);
			offset = 5;
		}
	}

	/* The len value is sanitized (see above) */
	if (!is_canfd) {
		if (view & CANLIB_VIEW_LEN8_DLC) {
			unsigned char dlc = cu->cc.len8_dlc;

			/* fall back to len if we don't have a valid DLC > 8 */
			if (!((len == CAN_MAX_DLEN) && (dlc > CAN_MAX_DLEN) &&
			      (dlc <= CAN_MAX_RAW_DLC)))
				dlc = len;

			buf[offset + 1] = '{';
			buf[offset + 2] = hex_asc_upper[dlc];
			buf[offset + 3] = '}';
		} else {
			buf[offset + 1] = '[';
			buf[offset + 2] = len + '0';
			buf[offset + 3] = ']';
		}

		/* standard CAN frames may have RTR enabled */
		if (cu->fd.can_id & CAN_RTR_FLAG) {
			offset += sprintf(buf + offset + 5, " remote request");
			return offset + 5;
		}
	} else {
		buf[offset] = '[';
		buf[offset + 1] = (len / 10) + '0';
		buf[offset + 2] = (len % 10) + '0';
		buf[offset + 3] = ']';
	}
	offset += 5;

	if (view & CANLIB_VIEW_BINARY) {
		/* _10101010 - dlen = 9, see above */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				buf[offset++] = (i == len - 1) ? ' ' : SWAP_DELIMITER;
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1 << j & cu->fd.data[i]) ? '1' : '0';
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1 << j & cu->fd.data[i]) ? '1' : '0';
			}
		}
	} else {
		/* _AA - dlen = 3, see above */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				if (i == len - 1)
					buf[offset++] = ' ';
				else
					buf[offset++] = SWAP_DELIMITER;

				put_hex_byte(buf + offset, cu->fd.data[i]);
				offset += 2;
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				put_hex_byte(buf + offset, cu->fd.data[i]);
				offset += 2;
			}
		}
	}

	buf[offset] = 0; /* terminate string */

	/*
	 * The ASCII & ERRORFRAME output is put at a fixed len behind the data.
	 * For now we support ASCII output only for payload length up to 8 bytes.
	 * Does it make sense to write 64 ASCII byte behind 64 ASCII HEX data on the console?
	 */
	if (len > CAN_MAX_DLEN)
		return offset;

	if (cu->fd.can_id & CAN_ERR_FLAG)
		offset += sprintf(buf + offset, "%*s", dlen * (8 - len) + 13, "ERRORFRAME");
	else if (view & CANLIB_VIEW_ASCII) {
		j = dlen * (8 - len) + 4;
		if (view & CANLIB_VIEW_SWAP) {
			sprintf(buf + offset, "%*s", j, "`");
			offset += j;
			for (i = len - 1; i >= 0; i--)
				if ((cu->fd.data[i] > 0x1F) && (cu->fd.data[i] < 0x7F))
					buf[offset++] = cu->fd.data[i];
				else
					buf[offset++] = '.';

			offset += sprintf(buf + offset, "`");
		} else {
			sprintf(buf + offset, "%*s", j, "'");
			offset += j;
			for (i = 0; i < len; i++)
				if ((cu->fd.data[i] > 0x1F) && (cu->fd.data[i] < 0x7F))
					buf[offset++] = cu->fd.data[i];
				else
					buf[offset++] = '.';

			offset += sprintf(buf + offset, "'");
		}
	}

	return offset;
}